

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O1

void __thiscall
rsg::BinaryVecOp<5,_true,_true,_false,_rsg::ComputeSubRange,_rsg::EvaluateSub>::evaluate
          (BinaryVecOp<5,_true,_true,_false,_rsg::ComputeSubRange,_rsg::EvaluateSub> *this,
          ExecValueAccess dst,ExecConstValueAccess a,ExecConstValueAccess b)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  VariableType *this_00;
  int compNdx;
  long lVar7;
  
  this_00 = dst.super_ConstStridedValueAccess<64>.m_type;
  if (this_00->m_baseType == TYPE_FLOAT) {
    if (0 < this_00->m_numElements) {
      iVar5 = 0;
      lVar6 = 0;
      do {
        lVar7 = 0;
        do {
          VariableType::getElementType(a.m_type);
          fVar1 = a.m_value[iVar5 + lVar7].floatVal;
          VariableType::getElementType(b.m_type);
          fVar2 = b.m_value[iVar5 + lVar7].floatVal;
          VariableType::getElementType(this_00);
          dst.super_ConstStridedValueAccess<64>.m_value[iVar5 + lVar7].floatVal = fVar1 - fVar2;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x40);
        lVar6 = lVar6 + 1;
        iVar5 = iVar5 + 0x40;
      } while (lVar6 < this_00->m_numElements);
    }
  }
  else if ((this_00->m_baseType == TYPE_INT) && (0 < this_00->m_numElements)) {
    iVar5 = 0;
    lVar6 = 0;
    do {
      lVar7 = 0;
      do {
        VariableType::getElementType(a.m_type);
        iVar3 = a.m_value[iVar5 + lVar7].intVal;
        VariableType::getElementType(b.m_type);
        iVar4 = b.m_value[iVar5 + lVar7].intVal;
        VariableType::getElementType(this_00);
        dst.super_ConstStridedValueAccess<64>.m_value[iVar5 + lVar7].intVal = iVar3 - iVar4;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x40);
      lVar6 = lVar6 + 1;
      iVar5 = iVar5 + 0x40;
    } while (lVar6 < this_00->m_numElements);
  }
  return;
}

Assistant:

void BinaryVecOp<Precedence, Float, Int, Bool, ComputeValueRange, EvaluateComp>::evaluate (ExecValueAccess dst, ExecConstValueAccess a, ExecConstValueAccess b)
{
	DE_ASSERT(dst.getType() == a.getType());
	DE_ASSERT(dst.getType() == b.getType());
	switch (dst.getType().getBaseType())
	{
		case VariableType::TYPE_FLOAT:
			for (int elemNdx = 0; elemNdx < dst.getType().getNumElements(); elemNdx++)
			{
				for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
					dst.component(elemNdx).asFloat(compNdx) = EvaluateComp()(a.component(elemNdx).asFloat(compNdx), b.component(elemNdx).asFloat(compNdx));
			}
			break;

		case VariableType::TYPE_INT:
			for (int elemNdx = 0; elemNdx < dst.getType().getNumElements(); elemNdx++)
			{
				for (int compNdx = 0; compNdx < EXEC_VEC_WIDTH; compNdx++)
					dst.component(elemNdx).asInt(compNdx) = EvaluateComp()(a.component(elemNdx).asInt(compNdx), b.component(elemNdx).asInt(compNdx));
			}
			break;

		default:
			DE_ASSERT(DE_FALSE); // Invalid type for multiplication
	}
}